

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::fair::recursive_timed_mutex::
try_lock_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (recursive_timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lk;
  id tid;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  recursive_timed_mutex *this_local;
  
  lk._8_8_ = std::this_thread::get_id();
  detail::timed_mutex_impl::internal_lock((timed_mutex_impl *)local_38);
  bVar1 = std::operator==((id)(this->owner_)._M_thread,(id)lk._8_8_);
  if (bVar1) {
    if (this->ncount_ == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x177,
                    "bool yamc::fair::recursive_timed_mutex::try_lock_until(const std::chrono::time_point<Clock, Duration> &) [Clock = std::chrono::system_clock, Duration = std::chrono::duration<long, std::ratio<1, 1000000000>>]"
                   );
    }
    this->ncount_ = this->ncount_ + 1;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = detail::timed_mutex_impl::
            impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&this->impl_,(unique_lock<std::mutex> *)local_38,tp);
    if (bVar1) {
      this->ncount_ = 1;
      (this->owner_)._M_thread = lk._8_8_;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool try_lock_until(const std::chrono::time_point<Clock, Duration>& tp)
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
      return true;
    }
    if (!impl_.impl_try_lockwait(lk, tp))
      return false;
    ncount_ = 1;
    owner_ = tid;
    return true;
  }